

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int height;
  int samples;
  ostream *poVar2;
  Image2D *this;
  time_t __seedval;
  Object *list;
  allocator local_21c;
  allocator local_21b;
  allocator local_21a;
  allocator local_219;
  Scene _scene;
  undefined1 local_1e8 [32];
  Camera _camera;
  Image2D *_image;
  undefined1 local_148 [32];
  undefined1 local_128 [32];
  string _type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string _name;
  
  if (argc < 5) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    std::operator<<(poVar2," width height samples filename\n");
    iVar1 = 1;
  }
  else {
    std::__cxx11::string::string((string *)&_camera,argv[1],(allocator *)&_scene);
    iVar1 = std::__cxx11::stoi((string *)&_camera,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&_camera);
    std::__cxx11::string::string((string *)&_camera,argv[2],(allocator *)&_scene);
    height = std::__cxx11::stoi((string *)&_camera,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&_camera);
    std::__cxx11::string::string((string *)&_camera,argv[3],(allocator *)&_scene);
    samples = std::__cxx11::stoi((string *)&_camera,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&_camera);
    std::__cxx11::string::string((string *)&_type,argv[5],(allocator *)&_camera);
    std::__cxx11::string::string((string *)&local_88,argv[4],&local_219);
    std::operator+(&local_68,&local_88,"_");
    std::__cxx11::string::string((string *)&local_a8,argv[1],&local_21a);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_image,
                   &local_68,&local_a8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_image,"_")
    ;
    std::__cxx11::string::string((string *)&local_c8,argv[2],&local_21b);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                   &local_c8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   "_");
    std::__cxx11::string::string((string *)&local_e8,argv[3],&local_21c);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_scene,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                   &local_e8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_camera,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_scene,".")
    ;
    std::operator+(&_name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &_camera,&_type);
    std::__cxx11::string::~string((string *)&_camera);
    std::__cxx11::string::~string((string *)&_scene);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)local_128);
    std::__cxx11::string::~string((string *)local_148);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)local_1e8);
    std::__cxx11::string::~string((string *)&_image);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    this = (Image2D *)operator_new(0x238);
    Image2D::Image2D(this,&_name,&_type,iVar1,height);
    _image = this;
    __seedval = time((time_t *)0x0);
    srand48(__seedval);
    local_128._0_8_ = (pointer)0x4080000041500000;
    local_128._8_4_ = 4.0;
    local_148._0_8_ = (pointer)0x0;
    local_148._8_4_ = 0.0;
    local_1e8._0_8_ = (pointer)0x3f80000000000000;
    local_1e8._8_4_ = 0.0;
    operator-((Vec3 *)local_128,(Vec3 *)local_148);
    Camera::Camera(&_camera,(Vec3 *)local_128,(Vec3 *)local_148,(Vec3 *)local_1e8,20.0,
                   (float)iVar1 / (float)height,0.0,
                   SQRT(_camera.m_origin.e[2] * _camera.m_origin.e[2] +
                        _camera.m_origin.e[0] * _camera.m_origin.e[0] +
                        _camera.m_origin.e[1] * _camera.m_origin.e[1]),0.0,1.0);
    Scene::Scene(&_scene,500,500,500);
    list = Scene::Create(&_scene);
    compute_ray_tracing(iVar1,height,samples,&_camera,list,this);
    safe_delete<Image2D>(&_image);
    if (list != (Object *)0x0) {
      (*list->_vptr_Object[1])(list);
    }
    Scene::~Scene(&_scene);
    std::__cxx11::string::~string((string *)&_name);
    std::__cxx11::string::~string((string *)&_type);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main (int argc, char *argv[])
{
    if (argc < 5) {
        std::cerr << "Usage: " << argv[0] << " width height samples filename\n";
        return 1;
    }

// Image
    const int         _width   = std::stoi(argv[1]);
    const int         _height  = std::stoi(argv[2]);
    const int         _samples = std::stoi(argv[3]);
	const std::string _type    = std::string(argv[5]);
    const std::string _name    = std::string(argv[4]) + "_" + std::string(argv[1]) + "_" + std::string(argv[2]) + "_" + std::string(argv[3]) + "." + _type;
	Image2D		     *_image   = new Image2D(_name, _type, _width, _height);

#ifdef RANDOM_SCENE
	INIT_RANDOM_GEN();
#endif

// Camera
    const Vec3  _origin         = Vec3(13.0f,  4.0f,  4.0f);
    const Vec3  _lookat         = Vec3( 0.0f,  0.0f,  0.0f);
    const Vec3  _up             = Vec3( 0.0f,  1.0f,  0.0f);
    const float _fov            = 20.0f;
    const float _aspect         = static_cast<float>(_width) / static_cast<float>(_height);
    const float _aperture       = 0.0f;
    const float _focus_distance = (_origin - _lookat).length();
    const float _shutter_open   = 0.0f;;
    const float _shutter_close  = 1.0f;;

    Camera _camera(_origin, _lookat, _up, _fov, _aspect, _aperture, _focus_distance, _shutter_open, _shutter_close);

// Scene
    Scene   _scene(500,500,500);
    Object *_objects_list = _scene.Create();

// Ray Tracing
	compute_ray_tracing(_width, _height, _samples, &_camera, _objects_list, _image);

// Clean
    safe_delete(_image);
    safe_delete(_objects_list);

    return 0;
}